

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Binder::PlanSubquery
          (Binder *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  undefined1 uVar1;
  Binder *pBVar2;
  type this_00;
  Binder *in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> in_RDI;
  RecursiveDependentJoinPlanner plan_1;
  type plan;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  subquery_root;
  shared_ptr<duckdb::Binder,_true> sub_binder;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *result_expression;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_000001b0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_000001b8;
  BoundSubqueryExpression *in_stack_000001c0;
  Binder *in_stack_000001c8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000ce0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000ce8;
  BoundSubqueryExpression *in_stack_00000cf0;
  Binder *in_stack_00000cf8;
  Binder *in_stack_fffffffffffffed8;
  RecursiveDependentJoinPlanner *in_stack_fffffffffffffee0;
  LogicalOperator *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  BinderType in_stack_ffffffffffffff7f;
  ClientContext *in_stack_ffffffffffffff80;
  optional_ptr<duckdb::Binder,_true> in_stack_ffffffffffffff88;
  LogicalOperator local_70;
  
  optional_ptr<duckdb::Binder,_true>::optional_ptr
            ((optional_ptr<duckdb::Binder,_true> *)
             ((long)&local_70.expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10),in_RSI);
  CreateBinder(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff7f);
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffee0);
  pBVar2->is_outside_flattened = false;
  shared_ptr<duckdb::Binder,_true>::operator->
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffee0);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffee0);
  CreatePlan(in_RSI,(BoundQueryNode *)in_RDI._M_head_impl);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffee0,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffed8);
  local_70.children.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = 0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x19e8abd);
  uVar1 = BoundSubqueryExpression::IsCorrelated((BoundSubqueryExpression *)0x19e8aca);
  if ((bool)uVar1) {
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffed8);
    PlanCorrelatedSubquery(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x19e8c34);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8c41);
  }
  else {
    in_stack_ffffffffffffff18 = &local_70;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffed8);
    PlanUncorrelatedSubquery
              (in_stack_00000cf8,in_stack_00000cf0,in_stack_00000ce8,in_stack_00000ce0);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffee0,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffed8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x19e8b54);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19e8b61);
  }
  pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffee0);
  if ((pBVar2->has_unplanned_dependent_joins & 1U) != 0) {
    RecursiveDependentJoinPlanner::RecursiveDependentJoinPlanner
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    this_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_stack_fffffffffffffee0);
    RecursiveDependentJoinPlanner::VisitOperator
              ((RecursiveDependentJoinPlanner *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    RecursiveDependentJoinPlanner::~RecursiveDependentJoinPlanner
              ((RecursiveDependentJoinPlanner *)this_00);
  }
  local_70.children.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = 1;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0x19e8d22);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0x19e8d2f);
  shared_ptr<duckdb::Binder,_true>::~shared_ptr((shared_ptr<duckdb::Binder,_true> *)0x19e8d3c);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         in_RDI._M_head_impl;
}

Assistant:

unique_ptr<Expression> Binder::PlanSubquery(BoundSubqueryExpression &expr, unique_ptr<LogicalOperator> &root) {
	D_ASSERT(root);
	// first we translate the QueryNode of the subquery into a logical plan
	auto sub_binder = Binder::CreateBinder(context, this);
	sub_binder->is_outside_flattened = false;
	auto subquery_root = sub_binder->CreatePlan(*expr.subquery);
	D_ASSERT(subquery_root);

	// now we actually flatten the subquery
	auto plan = std::move(subquery_root);

	unique_ptr<Expression> result_expression;
	if (!expr.IsCorrelated()) {
		result_expression = PlanUncorrelatedSubquery(*this, expr, root, std::move(plan));
	} else {
		result_expression = PlanCorrelatedSubquery(*this, expr, root, std::move(plan));
	}
	// finally, we recursively plan the nested subqueries (if there are any)
	if (sub_binder->has_unplanned_dependent_joins) {
		RecursiveDependentJoinPlanner plan(*this);
		plan.VisitOperator(*root);
	}
	return result_expression;
}